

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O3

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::generateTextureBuffer<float>(render *this,DeviceBufferType D,Engine *engine)

{
  Engine *extraout_RDX;
  Engine *extraout_RDX_00;
  Engine *extraout_RDX_01;
  Engine *extraout_RDX_02;
  Engine *extraout_RDX_03;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  string local_38;
  
  switch(D) {
  case Attribute:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bad call","");
    exception(&local_38);
    engine = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      engine = extraout_RDX_00;
    }
  default:
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    break;
  case Texture1d:
    (*engine->_vptr_Engine[0x24])(this,engine,7,0,0);
    engine = extraout_RDX_03;
    break;
  case Texture2d:
    (*engine->_vptr_Engine[0x26])(this,engine,7,0,0,0);
    engine = extraout_RDX_01;
    break;
  case Texture3d:
    (*engine->_vptr_Engine[0x28])(this,engine,7,0,0,0,0);
    engine = extraout_RDX_02;
  }
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)engine;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(DeviceBufferType D, Engine* engine) {
  switch (D) {
  case DeviceBufferType::Attribute:
    exception("bad call");
    break;
  case DeviceBufferType::Texture1d:
    return generateTextureBuffer<T, DeviceBufferType::Texture1d>(engine);
    break;
  case DeviceBufferType::Texture2d:
    return generateTextureBuffer<T, DeviceBufferType::Texture2d>(engine);
    break;
  case DeviceBufferType::Texture3d:
    return generateTextureBuffer<T, DeviceBufferType::Texture3d>(engine);
    break;
  }
  return nullptr;
}